

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void push_heap_suite::push_increasing_predicate(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  undefined1 local_70 [8];
  array<int,_4UL> expect_3;
  array<int,_4UL> expect_2;
  array<int,_4UL> expect_1;
  array<int,_4UL> expect;
  iterator last;
  array<int,_4UL> heap;
  
  memset(&last,0,0x10);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  *pvVar1 = 0xb;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::push_heap<int*,std::greater<int>>(pvVar2,pvVar1 + 1);
  stack0xffffffffffffffcc = 0xb;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_1._M_elems + 3));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_1._M_elems + 3));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x55,"void push_heap_suite::push_increasing_predicate()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[1] = 0x16;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::push_heap<int*,std::greater<int>>(pvVar2,pvVar1 + 2);
  stack0xffffffffffffffb8 = 0x160000000b;
  expect_1._M_elems[0] = 0;
  expect_1._M_elems[1] = 0;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_2._M_elems + 3));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_2._M_elems + 3));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x5c,"void push_heap_suite::push_increasing_predicate()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[2] = 0x21;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::push_heap<int*,std::greater<int>>(pvVar2,pvVar1 + 3);
  stack0xffffffffffffffa4 = 0x160000000b;
  expect_2._M_elems[0] = 0x21;
  expect_2._M_elems[1] = 0;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_3._M_elems + 3));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_3._M_elems + 3));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,99,"void push_heap_suite::push_increasing_predicate()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[3] = 0x2c;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::push_heap<int*,std::greater<int>>(pvVar2,pvVar1 + 4);
  local_70._0_4_ = 0xb;
  local_70._4_4_ = 0x16;
  expect_3._M_elems[0] = 0x21;
  expect_3._M_elems[1] = 0x2c;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_70);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)local_70);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x6a,"void push_heap_suite::push_increasing_predicate()",pvVar1,pvVar2,pvVar3,pvVar4);
  return;
}

Assistant:

void push_increasing_predicate()
{
    std::array<int, 4> heap = {};
    auto last = heap.begin();
    *last++ = 11;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 11, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 22;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 11, 22, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 33;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 11, 22, 33, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 44;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}